

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::InternalSwap
          (RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  Arena *pAVar4;
  Arena *pAVar5;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e8);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (this->rep_ == (Rep *)0x0) {
    pAVar4 = (Arena *)0x0;
  }
  else {
    pAVar4 = this->rep_->arena;
  }
  if (other->rep_ == (Rep *)0x0) {
    pAVar5 = (Arena *)0x0;
  }
  else {
    pAVar5 = other->rep_->arena;
  }
  if (pAVar4 != pAVar5) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e9);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_98,
                        "CHECK failed: GetArenaNoVirtual() == other->GetArenaNoVirtual(): ");
    internal::LogFinisher::operator=(&local_99,pLVar3);
    internal::LogMessage::~LogMessage(&local_98);
  }
  pRVar2 = this->rep_;
  this->rep_ = other->rep_;
  other->rep_ = pRVar2;
  iVar1 = this->current_size_;
  this->current_size_ = other->current_size_;
  other->current_size_ = iVar1;
  iVar1 = this->total_size_;
  this->total_size_ = other->total_size_;
  other->total_size_ = iVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}